

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

Constant * __thiscall soul::heart::Allocator::allocateConstant(Allocator *this,Value *value)

{
  Constant *pCVar1;
  CodeLocation local_28;
  Value *local_18;
  Value *value_local;
  Allocator *this_local;
  
  local_28.sourceCode.object = (SourceCodeText *)0x0;
  local_28.location.data = (char *)0x0;
  local_18 = value;
  value_local = (Value *)this;
  CodeLocation::CodeLocation(&local_28);
  pCVar1 = allocate<soul::heart::Constant,soul::CodeLocation,soul::Value>(this,&local_28,value);
  CodeLocation::~CodeLocation(&local_28);
  return pCVar1;
}

Assistant:

Constant& allocateConstant (Value value)              { return allocate<heart::Constant> (CodeLocation(), std::move (value)); }